

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribute.c
# Opt level: O0

int distribute_info(mixed_segment_info *info,mixed_segment *segment)

{
  mixed_segment_field_info *field;
  mixed_segment *segment_local;
  mixed_segment_info *info_local;
  
  __ignore('\0');
  info->name = "distribute";
  info->description = "Multiplexes a buffer to multiple outputs to consume it from.";
  info->min_inputs = 1;
  info->max_inputs = 1;
  info->outputs = 0xffffffff;
  set_info_field(info->fields,0,MIXED_BUFFER_POINTER,1,MIXED_SET|MIXED_MODIFIES_INPUT|MIXED_IN,
                 "The buffer for audio data attached to the location.");
  clear_info_field(info->fields + 1);
  return 1;
}

Assistant:

int distribute_info(struct mixed_segment_info *info, struct mixed_segment *segment){
  IGNORE(segment);
  
  info->name = "distribute";
  info->description = "Multiplexes a buffer to multiple outputs to consume it from.";
  info->min_inputs = 1;
  info->max_inputs = 1;
  info->outputs = -1;
  
  struct mixed_segment_field_info *field = info->fields;
  set_info_field(field++, MIXED_BUFFER,
                 MIXED_BUFFER_POINTER, 1, MIXED_IN | MIXED_OUT | MIXED_SET,
                 "The buffer for audio data attached to the location.");
  clear_info_field(field++);
  return 1;
}